

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  string *in_RDI;
  FilePath result;
  FilePath output_name;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  FilePath local_78;
  string local_58;
  string local_38;
  
  if (FLAGS_gtest_output_abi_cxx11_ == (char *)0x0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    pcVar2 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
    if (pcVar2 == (char *)0x0) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,(allocator<char> *)&local_38);
      FilePath::FilePath((FilePath *)&local_d8,&local_b8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"test_detail.xml","");
      FilePath::FilePath((FilePath *)&local_98,&local_58);
      FilePath::ConcatPaths(&local_78,(FilePath *)&local_d8,(FilePath *)&local_98);
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.pathname_._M_dataplus._M_p != &local_78.pathname_.field_2) {
        operator_delete(local_78.pathname_._M_dataplus._M_p,
                        local_78.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return in_RDI;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,pcVar2 + 1,(allocator<char> *)&local_b8);
      FilePath::FilePath(&local_78,&local_d8);
      paVar1 = &local_d8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (*local_78.pathname_._M_dataplus._M_p != '/') {
        UnitTest::GetInstance();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,
                   ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                   _M_dataplus._M_p,&local_d9);
        FilePath::FilePath((FilePath *)&local_b8,&local_98);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar2 + 1,&local_da)
        ;
        FilePath::FilePath((FilePath *)&local_58,&local_38);
        FilePath::ConcatPaths((FilePath *)&local_d8,(FilePath *)&local_b8,(FilePath *)&local_58);
        std::__cxx11::string::_M_assign((string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if ((local_78.pathname_._M_string_length == 0) ||
         (local_78.pathname_._M_dataplus._M_p[local_78.pathname_._M_string_length - 1] != '/')) {
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char*>();
      }
      else {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)&local_d8,&local_78,(FilePath *)&local_b8,local_98._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char*>();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar1) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      local_b8.field_2._M_allocated_capacity = local_78.pathname_.field_2._M_allocated_capacity;
      local_b8._M_dataplus._M_p = local_78.pathname_._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.pathname_._M_dataplus._M_p == &local_78.pathname_.field_2) {
        return in_RDI;
      }
    }
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}